

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O0

void strappend_base64(xar *xar,archive_string *as,char *s,size_t l)

{
  size_t sVar1;
  uchar *puVar2;
  byte *pbVar3;
  uint local_144;
  size_t sStack_140;
  int n;
  size_t len;
  uchar *b;
  uchar *out;
  uchar buff [256];
  size_t l_local;
  char *s_local;
  archive_string *as_local;
  xar *xar_local;
  
  sStack_140 = 0;
  b = (uchar *)&out;
  len = (size_t)s;
  buff._248_8_ = l;
  do {
    sVar1 = sStack_140;
    if (((buff._248_8_ == 0) || (base64[*(byte *)len] < 0)) || (base64[*(byte *)(len + 1)] < 0))
    goto LAB_0017da60;
    pbVar3 = (byte *)(len + 2);
    local_144 = base64[*(byte *)(len + 1)] << 0xc | base64[*(byte *)len] << 0x12;
    *b = (uchar)(local_144 >> 0x10);
    buff._248_8_ = buff._248_8_ + -2;
    sVar1 = sStack_140 + 1;
    puVar2 = b + 1;
    if (buff._248_8_ != 0) {
      if (base64[*pbVar3] < 0) {
LAB_0017da60:
        sStack_140 = sVar1;
        if (sStack_140 != 0) {
          archive_strncat(as,&out,sStack_140);
        }
        return;
      }
      local_144 = base64[*pbVar3] << 6 | local_144;
      b[1] = (uchar)(local_144 >> 8);
      buff._248_8_ = buff._248_8_ + -1;
      sVar1 = sStack_140 + 2;
      pbVar3 = (byte *)(len + 3);
      puVar2 = b + 2;
    }
    b = puVar2;
    len = (size_t)pbVar3;
    sStack_140 = sVar1;
    if (buff._248_8_ != 0) {
      sVar1 = sStack_140;
      if (base64[*(byte *)len] < 0) goto LAB_0017da60;
      *b = (byte)base64[*(byte *)len] | (byte)local_144;
      sStack_140 = sStack_140 + 1;
      buff._248_8_ = buff._248_8_ + -1;
      len = len + 1;
      b = b + 1;
    }
    if (0xff < sStack_140 + 3) {
      archive_strncat(as,&out,sStack_140);
      sStack_140 = 0;
      b = (uchar *)&out;
    }
  } while( true );
}

Assistant:

static void
strappend_base64(struct xar *xar,
    struct archive_string *as, const char *s, size_t l)
{
	unsigned char buff[256];
	unsigned char *out;
	const unsigned char *b;
	size_t len;

	(void)xar; /* UNUSED */
	len = 0;
	out = buff;
	b = (const unsigned char *)s;
	while (l > 0) {
		int n = 0;

		if (base64[b[0]] < 0 || base64[b[1]] < 0)
			break;
		n = base64[*b++] << 18;
		n |= base64[*b++] << 12;
		*out++ = n >> 16;
		len++;
		l -= 2;

		if (l > 0) {
			if (base64[*b] < 0)
				break;
			n |= base64[*b++] << 6;
			*out++ = (n >> 8) & 0xFF;
			len++;
			--l;
		}
		if (l > 0) {
			if (base64[*b] < 0)
				break;
			n |= base64[*b++];
			*out++ = n & 0xFF;
			len++;
			--l;
		}
		if (len+3 >= sizeof(buff)) {
			archive_strncat(as, (const char *)buff, len);
			len = 0;
			out = buff;
		}
	}
	if (len > 0)
		archive_strncat(as, (const char *)buff, len);
}